

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

Node * __thiscall
p2t::Sweep::NewFrontTriangle(Sweep *this,SweepContext *tcx,Point *point,Node *node)

{
  bool bVar1;
  Triangle *this_00;
  Node *this_01;
  Node *local_48;
  Node *new_node;
  Triangle *local_30;
  Triangle *triangle;
  Node *node_local;
  Point *point_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  triangle = (Triangle *)node;
  node_local = (Node *)point;
  point_local = (Point *)tcx;
  tcx_local = (SweepContext *)this;
  this_00 = (Triangle *)operator_new(0x40);
  Triangle::Triangle(this_00,(Point *)node_local,*(Point **)triangle,
                     (Point *)triangle->points_[1]->x);
  local_30 = this_00;
  Triangle::MarkNeighbor(this_00,(Triangle *)triangle->points_[0]);
  SweepContext::AddToMap((SweepContext *)point_local,local_30);
  this_01 = (Node *)operator_new(0x28);
  p2t::Node::Node(this_01,(Point *)node_local);
  local_48 = this_01;
  std::vector<p2t::Node_*,_std::allocator<p2t::Node_*>_>::push_back(&this->nodes_,&local_48);
  local_48->next = (Node *)triangle->points_[1];
  local_48->prev = (Node *)triangle;
  (triangle->points_[1]->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_48;
  triangle->points_[1] = (Point *)local_48;
  bVar1 = Legalize(this,(SweepContext *)point_local,local_30);
  if (!bVar1) {
    SweepContext::MapTriangleToNodes((SweepContext *)point_local,local_30);
  }
  return local_48;
}

Assistant:

Node& Sweep::NewFrontTriangle(SweepContext& tcx, Point& point, Node& node)
{
  Triangle* triangle = new Triangle(point, *node.point, *node.next->point);

  triangle->MarkNeighbor(*node.triangle);
  tcx.AddToMap(triangle);

  Node* new_node = new Node(point);
  nodes_.push_back(new_node);

  new_node->next = node.next;
  new_node->prev = &node;
  node.next->prev = new_node;
  node.next = new_node;

  if (!Legalize(tcx, *triangle)) {
    tcx.MapTriangleToNodes(*triangle);
  }

  return *new_node;
}